

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture_fuzz.cpp
# Opt level: O3

bool __thiscall capture_fuzz::FuzzPacket(capture_fuzz *this,uint8_t *packet,size_t packet_length)

{
  long lVar1;
  ulong uVar2;
  uint8_t *__dest;
  size_t new_size;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = this->fuzz_random_context + 0x9e3779b97f4a7c15;
  this->fuzz_random_context = uVar2;
  if (7 < packet_length) {
    uVar2 = (uVar2 >> 0x1e ^ uVar2) * -0x40a7b892e31b1a47;
    uVar2 = (uVar2 >> 0x1b ^ uVar2) * -0x6b2fb644ecceee15;
    uVar2 = uVar2 >> 0x1f ^ uVar2;
    if (this->buffer_size < packet_length) {
      __dest = (uint8_t *)operator_new__(packet_length);
      if (this->buffer != (uint8_t *)0x0) {
        operator_delete__(this->buffer);
      }
      this->buffer = __dest;
      this->buffer_size = packet_length;
    }
    else {
      __dest = this->buffer;
    }
    uVar4 = 0;
    memcpy(__dest,packet,packet_length);
    uVar3 = this->fuzz_random_context + 0x9e3779b97f4a7c15;
    this->fuzz_random_context = uVar3;
    uVar3 = (uVar3 >> 0x1e ^ uVar3) * -0x40a7b892e31b1a47;
    uVar3 = (uVar3 >> 0x1b ^ uVar3) * -0x6b2fb644ecceee15;
    uVar3 = uVar3 >> 0x1f ^ uVar3;
    do {
      packet[uVar4] = (uint8_t)uVar3;
      if (((uint)(uVar2 >> 0x11) & 7) <= uVar4) break;
      uVar3 = uVar3 >> 8;
      lVar1 = uVar4 + uVar2 % packet_length;
      uVar4 = uVar4 + 1;
    } while (lVar1 + 1U < packet_length);
    this->fuzzed_length = packet_length;
  }
  return 7 < packet_length;
}

Assistant:

bool capture_fuzz::FuzzPacket(uint8_t * packet, size_t packet_length)
{
    bool ret = true;
    uint64_t random_pilot = picoquic_test_random(&fuzz_random_context);

    if (packet_length < 8) {
        return false;
    }

    /* Reallocate the capture buffer */
    if (packet_length > buffer_size)
    {
        size_t new_size = packet_length;
        uint8_t * new_buf = new uint8_t[packet_length];
        if (new_buf == NULL)
        {
            ret = false;
        }
        else
        {
            if (buffer != NULL)
            {
                delete[] buffer;
            }
            buffer = new_buf;
            buffer_size = new_size;
        }
    }

    if (ret) {
        /* smash some random location in the packet */
        size_t x = random_pilot % packet_length;
        size_t y = (size_t)((random_pilot >> 17) & 0x07) + 1;

        memcpy(buffer, packet, packet_length);

        random_pilot = picoquic_test_random(&fuzz_random_context);
        for (size_t i = 0; i < y && x + i < packet_length; i++) {
            packet[i] = (uint8_t)(random_pilot & 0xFF);
            random_pilot >>= 8;
        }

        fuzzed_length = packet_length;
    }

    return ret;
}